

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O0

REF_STATUS ref_phys_read_mapbc(REF_DICT ref_dict,char *mapbc_filename)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char local_438 [4];
  REF_STATUS ref_private_macro_code_rss;
  char buffer [1024];
  REF_INT type;
  REF_INT id;
  REF_INT n;
  REF_INT i;
  FILE *file;
  char *mapbc_filename_local;
  REF_DICT ref_dict_local;
  
  file = (FILE *)mapbc_filename;
  mapbc_filename_local = (char *)ref_dict;
  _n = fopen(mapbc_filename,"r");
  if (_n == (FILE *)0x0) {
    printf("unable to open %s\n",file);
  }
  if (_n == (FILE *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x193,
           "ref_phys_read_mapbc","unable to open file");
    ref_dict_local._4_4_ = 2;
  }
  else {
    pcVar3 = fgets(local_438,0x400,_n);
    if (local_438 == pcVar3) {
      iVar1 = __isoc99_sscanf(local_438,"%d",&type);
      if (iVar1 == 1) {
        for (id = 0; id < type; id = id + 1) {
          iVar1 = __isoc99_fscanf(_n,"%d",buffer + 0x3fc);
          if (iVar1 != 1) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x198,"ref_phys_read_mapbc","read id");
            return 1;
          }
          iVar1 = __isoc99_fscanf(_n,"%d",buffer + 0x3f8);
          if (iVar1 != 1) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x199,"ref_phys_read_mapbc","read type");
            return 1;
          }
          fgets(local_438,0x400,_n);
          uVar2 = ref_dict_store((REF_DICT)mapbc_filename_local,buffer._1020_4_,buffer._1016_4_);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x19b,"ref_phys_read_mapbc",(ulong)uVar2,"store");
            return uVar2;
          }
        }
        fclose(_n);
        ref_dict_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               0x196,"ref_phys_read_mapbc","unable to parse number of lines");
        ref_dict_local._4_4_ = 1;
      }
    }
    else {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x195,
             "ref_phys_read_mapbc","unable to read number of lines");
      ref_dict_local._4_4_ = 1;
    }
  }
  return ref_dict_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_phys_read_mapbc(REF_DICT ref_dict,
                                       const char *mapbc_filename) {
  FILE *file;
  REF_INT i, n, id, type;
  char buffer[1024];
  file = fopen(mapbc_filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", mapbc_filename);
  RNS(file, "unable to open file");
  RAS(buffer == fgets(buffer, sizeof(buffer), file),
      "unable to read number of lines");
  RES(1, sscanf(buffer, "%d", &n), "unable to parse number of lines");
  for (i = 0; i < n; i++) {
    RES(1, fscanf(file, "%d", &id), "read id");
    RES(1, fscanf(file, "%d", &type), "read type");
    fgets(buffer, sizeof(buffer), file);
    RSS(ref_dict_store(ref_dict, id, type), "store");
  }
  fclose(file);
  return REF_SUCCESS;
}